

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

int write_to_file(WFile *f,void *buffer,int length)

{
  uint uVar1;
  ssize_t sVar2;
  int so_far;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    if (length < 1) {
      return iVar3;
    }
    sVar2 = write(f->fd,buffer,(ulong)(uint)length);
    uVar1 = (uint)sVar2;
    if ((int)uVar1 < 0) break;
    if (uVar1 == 0) {
      return iVar3;
    }
    buffer = (void *)((long)buffer + (ulong)(uVar1 & 0x7fffffff));
    length = length - uVar1;
    iVar3 = iVar3 + uVar1;
  }
  return uVar1;
}

Assistant:

int write_to_file(WFile *f, void *buffer, int length)
{
    char *p = (char *)buffer;
    int so_far = 0;

    /* Keep trying until we've really written as much as we can. */
    while (length > 0) {
        int ret = write(f->fd, p, length);

        if (ret < 0)
            return ret;

        if (ret == 0)
            break;

        p += ret;
        length -= ret;
        so_far += ret;
    }

    return so_far;
}